

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O3

void __thiscall wasm::Instrumenter::addSecondaryMemory(Instrumenter *this,size_t numFuncs)

{
  InstrumenterConfig *pIVar1;
  char *pcVar2;
  Name root;
  string_view sVar3;
  undefined1 local_1b0 [8];
  __single_object memory;
  
  pIVar1 = this->config;
  if (pIVar1->storageKind == InSecondaryMemory) {
    local_1b0 = (undefined1  [8])this->wasm;
    if (((((Module *)local_1b0)->features).features & 0x10000) == 0) {
      Fatal::Fatal((Fatal *)local_1b0);
      Fatal::operator<<((Fatal *)local_1b0,
                        (char (*) [67])
                        "error: --in-secondary-memory requires multi-memories to be enabled");
      Fatal::~Fatal((Fatal *)local_1b0);
    }
    memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
         (__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>)0x0;
    root.super_IString.str._M_str = local_1b0;
    root.super_IString.str._M_len = (size_t)(pIVar1->secondaryMemoryName).super_IString.str._M_str;
    sVar3 = (string_view)
            Names::getValidName((Names *)(pIVar1->secondaryMemoryName).super_IString.str._M_len,root
                                ,(function<bool_(wasm::Name)> *)local_1b0);
    std::
    _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:92:23)>
    ::_M_manager((_Any_data *)local_1b0,(_Any_data *)local_1b0,__destroy_functor);
    (this->secondaryMemory).super_IString.str = sVar3;
    pcVar2 = (char *)(numFuncs + 0xffff >> 0x10);
    local_1b0 = (undefined1  [8])operator_new(0x58);
    ((string_view *)((long)local_1b0 + 0x10))->_M_len = 0;
    ((string_view *)((long)local_1b0 + 0x10))->_M_str = (char *)0x0;
    ((string_view *)((long)local_1b0 + 0x20))->_M_len = 0;
    ((string_view *)((long)local_1b0 + 0x20))->_M_str = (char *)0x0;
    ((string_view *)((long)local_1b0 + 0x30))->_M_len = 0;
    ((string_view *)((long)local_1b0 + 0x30))->_M_str = (char *)0x0;
    ((string_view *)((long)local_1b0 + 0x40))->_M_len = 0;
    ((string_view *)((long)local_1b0 + 0x40))->_M_str = (char *)0x0;
    *(string_view *)local_1b0 = sVar3;
    ((string_view *)((long)local_1b0 + 0x30))->_M_str = pcVar2;
    ((string_view *)((long)local_1b0 + 0x40))->_M_len = (size_t)pcVar2;
    *(undefined1 *)&((string_view *)((long)local_1b0 + 0x40))->_M_str = 1;
    ((string_view *)((long)local_1b0 + 0x50))->_M_len = 2;
    pIVar1 = this->config;
    pcVar2 = (pIVar1->importNamespace).super_IString.str._M_str;
    ((string_view *)((long)local_1b0 + 0x10))->_M_str =
         (char *)(pIVar1->importNamespace).super_IString.str._M_len;
    ((string_view *)((long)local_1b0 + 0x20))->_M_len = (size_t)pcVar2;
    pcVar2 = (pIVar1->secondaryMemoryName).super_IString.str._M_str;
    ((string_view *)((long)local_1b0 + 0x20))->_M_str =
         (char *)(pIVar1->secondaryMemoryName).super_IString.str._M_len;
    ((string_view *)((long)local_1b0 + 0x30))->_M_len = (size_t)pcVar2;
    wasm::Module::addMemory((unique_ptr *)this->wasm);
    if (local_1b0 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1b0,0x58);
    }
  }
  return;
}

Assistant:

void Instrumenter::addSecondaryMemory(size_t numFuncs) {
  if (config.storageKind != WasmSplitOptions::StorageKind::InSecondaryMemory) {
    // Don't need secondary memory
    return;
  }
  if (!wasm->features.hasMultiMemories()) {
    Fatal()
      << "error: --in-secondary-memory requires multi-memories to be enabled";
  }

  secondaryMemory =
    Names::getValidMemoryName(*wasm, config.secondaryMemoryName);
  // Create a memory with enough pages to write into
  size_t pages = (numFuncs + Memory::kPageSize - 1) / Memory::kPageSize;
  auto mem = Builder::makeMemory(secondaryMemory, pages, pages, true);
  mem->module = config.importNamespace;
  mem->base = config.secondaryMemoryName;
  wasm->addMemory(std::move(mem));
}